

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_address_base.cpp
# Opt level: O0

GetAddressInfoResponseStruct *
cfd::js::api::AddressApiBase::GetAddressInfo
          (GetAddressInfoResponseStruct *__return_storage_ptr__,GetAddressInfoRequestStruct *request
          ,AddressFactory *address_factory,Address *address_data)

{
  AddressType address_type;
  WitnessVersion WVar1;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar2;
  ByteData local_2a0;
  string local_288 [32];
  _Base_ptr local_268;
  undefined1 local_260;
  allocator local_251;
  string local_250 [32];
  AddressApiBase local_230 [32];
  Script local_210;
  string local_1d8 [48];
  string local_1a8 [8];
  Address address;
  Address *address_data_local;
  AddressFactory *address_factory_local;
  GetAddressInfoRequestStruct *request_local;
  GetAddressInfoResponseStruct *response;
  
  GetAddressInfoResponseStruct::GetAddressInfoResponseStruct(__return_storage_ptr__);
  cfd::AddressFactory::GetAddress(local_1a8);
  if (address_data != (Address *)0x0) {
    cfd::core::Address::operator=(address_data,(Address *)local_1a8);
  }
  cfd::core::Address::GetLockingScript();
  cfd::core::Script::GetHex_abi_cxx11_();
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  core::Script::~Script(&local_210);
  address_type = core::Address::GetAddressType((Address *)local_1a8);
  ConvertAddressTypeText_abi_cxx11_(local_230,address_type);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->hash_type,(string *)local_230);
  std::__cxx11::string::~string((string *)local_230);
  WVar1 = core::Address::GetWitnessVersion((Address *)local_1a8);
  __return_storage_ptr__->witness_version = WVar1;
  if (__return_storage_ptr__->witness_version < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_250,"witnessVersion",&local_251);
    pVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&__return_storage_ptr__->ignore_items,(value_type *)local_250);
    local_268 = (_Base_ptr)pVar2.first._M_node;
    local_260 = pVar2.second;
    std::__cxx11::string::~string(local_250);
    std::allocator<char>::~allocator((allocator<char> *)&local_251);
  }
  core::Address::GetHash(&local_2a0,(Address *)local_1a8);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->hash,local_288);
  std::__cxx11::string::~string(local_288);
  core::ByteData::~ByteData(&local_2a0);
  core::Address::~Address((Address *)local_1a8);
  return __return_storage_ptr__;
}

Assistant:

GetAddressInfoResponseStruct AddressApiBase::GetAddressInfo(
    const GetAddressInfoRequestStruct& request,
    const AddressFactory* address_factory, Address* address_data) {
  GetAddressInfoResponseStruct response;
  Address address = address_factory->GetAddress(request.address);
  if (address_data != nullptr) *address_data = address;

  response.locking_script = address.GetLockingScript().GetHex();
  response.hash_type = ConvertAddressTypeText(address.GetAddressType());
  response.witness_version = static_cast<int32_t>(address.GetWitnessVersion());
  if (response.witness_version < 0) {
    response.ignore_items.insert("witnessVersion");
  }
  response.hash = address.GetHash().GetHex();
  return response;
}